

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive_manifest.cpp
# Opt level: O1

ON_ComponentManifestHash32TableItem * __thiscall
ON_ComponentIdHash32Table::AddManifestItem
          (ON_ComponentIdHash32Table *this,ON_ComponentManifestItem_PRIVATE *manifest_item)

{
  ON_FixedSizePool *this_00;
  ON_UUID *pOVar1;
  bool bVar2;
  ON__UINT32 hash32;
  ON_UUID *pOVar3;
  ON_ComponentManifestHash32TableItem *item;
  ON_UUID id;
  ON_UUID_struct local_28;
  
  pOVar3 = &(manifest_item->super_ON_ComponentManifestItem).m_id;
  if (manifest_item == (ON_ComponentManifestItem_PRIVATE *)0x0) {
    pOVar3 = &ON_nil_uuid;
  }
  pOVar1 = &ON_nil_uuid;
  if (manifest_item != (ON_ComponentManifestItem_PRIVATE *)0x0) {
    pOVar1 = &(manifest_item->super_ON_ComponentManifestItem).m_id;
  }
  local_28.Data4 = *&pOVar1->Data4;
  local_28.Data1 = pOVar3->Data1;
  local_28.Data2 = pOVar3->Data2;
  local_28.Data3 = pOVar3->Data3;
  bVar2 = ::operator==(&ON_nil_uuid,&local_28);
  if (!bVar2) {
    hash32 = ON_CRC32(0,0x10,&local_28);
    item = ON_ManifestHash32TableItemFixedSizePool::AllocateHashTableItem(this->m_fsp,manifest_item)
    ;
    bVar2 = ON_Hash32Table::AddItem
                      (&this->super_ON_Hash32Table,hash32,&item->super_ON_Hash32TableItem);
    if (bVar2) {
      return item;
    }
    if (item != (ON_ComponentManifestHash32TableItem *)0x0) {
      this_00 = &this->m_fsp->super_ON_FixedSizePool;
      item->m_manifest_item = (ON_ComponentManifestItem_PRIVATE *)0x0;
      ON_FixedSizePool::ReturnElement(this_00,item);
    }
  }
  return (ON_ComponentManifestHash32TableItem *)0x0;
}

Assistant:

const ON_ComponentManifestHash32TableItem* AddManifestItem(
    const class ON_ComponentManifestItem_PRIVATE* manifest_item
    )
  {
    const ON_UUID id = IdFromManifestItem(manifest_item);
    if ( ON_nil_uuid == id )
      return nullptr;
    const ON__UINT32 hash32 = ON_ComponentIdHash32Table::IdHash32(id);
    
    ON_ComponentManifestHash32TableItem* hash_table_item = m_fsp.AllocateHashTableItem(manifest_item);
    if ( AddItem( hash32, hash_table_item ) )
      return hash_table_item;

    m_fsp.ReturnHashTableItem(hash_table_item);
    return nullptr;
  }